

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O1

uint32_t icu_63::CollationFastLatin::lookupUTF8Unsafe
                   (uint16_t *table,UChar32 c,uint8_t *s8,int32_t *sIndex)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  
  if (c < 0xc6) {
    iVar2 = *sIndex;
    *sIndex = iVar2 + 1;
    return (uint32_t)table[(long)(c * 0x40 + -0x3080) + (ulong)s8[iVar2]];
  }
  bVar1 = s8[(long)*sIndex + 1];
  *sIndex = *sIndex + 2;
  if (c == 0xe2) {
    return (uint32_t)table[(ulong)bVar1 + 0x100];
  }
  uVar3 = 0xfca8;
  if (bVar1 == 0xbe) {
    uVar3 = 3;
  }
  return uVar3;
}

Assistant:

uint32_t
CollationFastLatin::lookupUTF8Unsafe(const uint16_t *table, UChar32 c,
                                     const uint8_t *s8, int32_t &sIndex) {
    // The caller handled ASCII.
    // The string is well-formed and contains only supported characters.
    U_ASSERT(c > 0x7f);
    if(c <= LATIN_MAX_UTF8_LEAD) {
        return table[((c - 0xc2) << 6) + s8[sIndex++]];  // 0080..017F
    }
    uint8_t t2 = s8[sIndex + 1];
    sIndex += 2;
    if(c == 0xe2) {
        return table[(LATIN_LIMIT - 0x80) + t2];  // 2000..203F -> 0180..01BF
    } else if(t2 == 0xbe) {
        return MERGE_WEIGHT;  // U+FFFE
    } else {
        return MAX_SHORT | COMMON_SEC | LOWER_CASE | COMMON_TER;  // U+FFFF
    }
}